

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

OASIS_FLOAT ** __thiscall
summarycalc::alloc_ssl_arrays(summarycalc *this,int summary_set,int sample_size)

{
  int iVar1;
  OASIS_FLOAT **ppOVar2;
  OASIS_FLOAT *pOVar3;
  OASIS_FLOAT **extraout_RAX;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->min_summary_id_[summary_set] == 1) {
    iVar1 = this->max_summary_id_[summary_set];
    uVar5 = (long)(int)(iVar1 + 1U) << 3;
    if (iVar1 < -1) {
      uVar5 = 0xffffffffffffffff;
    }
    ppOVar2 = (OASIS_FLOAT **)operator_new__(uVar5);
    if (-1 < iVar1) {
      lVar4 = (long)sample_size + (long)this->num_idx_;
      uVar5 = lVar4 * 4 + 4;
      if ((int)lVar4 < -1) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar6 = 0;
      do {
        pOVar3 = (OASIS_FLOAT *)operator_new__(uVar5);
        ppOVar2[uVar6] = pOVar3;
        uVar6 = uVar6 + 1;
      } while (iVar1 + 1U != uVar6);
    }
    return ppOVar2;
  }
  alloc_ssl_arrays();
  lVar4 = 0;
  ppOVar2 = extraout_RAX;
  do {
    if (this->fout[lVar4] != (FILE *)0x0) {
      ppOVar2 = alloc_ssl_arrays(this,(int)lVar4,summary_set);
      this->sssl[lVar4] = ppOVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  return ppOVar2;
}

Assistant:

OASIS_FLOAT **summarycalc::alloc_ssl_arrays(int summary_set, int sample_size)
{
	if (min_summary_id_[summary_set] != 1) {
		fprintf(stderr, "FATAL: summarycalc: Minimum summary ID is not equal to one\n");
		exit(-1);
	}
	int maxsummaryids = max_summary_id_[summary_set] ;
	OASIS_FLOAT **ssl = new OASIS_FLOAT*[maxsummaryids + 1];
	for (int i = 0; i <= maxsummaryids; i++){
		ssl[i] = new OASIS_FLOAT[sample_size + num_idx_ + 1];   // allocate for -5, -4, -3, -2, -1, 0 as well as samplesize
	}
	return ssl;
}